

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_avx2.c
# Opt level: O0

void fdct64_stage7_avx2(__m256i *x6,__m256i *x7,__m256i *cospi_p08,__m256i *cospi_p56,
                       __m256i *cospi_p40,__m256i *cospi_p24,__m256i *cospi_m08,__m256i *cospi_m56,
                       __m256i *cospi_m40,__m256i *cospi_m24,__m256i *__rounding,int8_t cos_bit)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined1 (*in_RCX) [32];
  undefined1 (*in_RDX) [32];
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  undefined1 (*in_R8) [32];
  undefined1 (*in_R9) [32];
  undefined1 (*in_stack_00000008) [32];
  __m256i in1_w1_5;
  __m256i in0_w0_5;
  __m256i in1_w0_4;
  __m256i in0_w1_4;
  __m256i in1_w1_4;
  __m256i in0_w0_4;
  __m256i in1_w0_3;
  __m256i in0_w1_3;
  __m256i in1_w1_3;
  __m256i in0_w0_3;
  __m256i in1_w0_2;
  __m256i in0_w1_2;
  __m256i in1_w1_2;
  __m256i in0_w0_2;
  __m256i in1_w0_1;
  __m256i in0_w1_1;
  __m256i in1_w1_1;
  __m256i in0_w0_1;
  __m256i in1_w0;
  __m256i in0_w1;
  __m256i in1_w1;
  __m256i in0_w0;
  
  uVar3 = in_RDI[1];
  uVar4 = in_RDI[2];
  uVar5 = in_RDI[3];
  *in_RSI = *in_RDI;
  in_RSI[1] = uVar3;
  in_RSI[2] = uVar4;
  in_RSI[3] = uVar5;
  uVar3 = in_RDI[5];
  uVar4 = in_RDI[6];
  uVar5 = in_RDI[7];
  in_RSI[4] = in_RDI[4];
  in_RSI[5] = uVar3;
  in_RSI[6] = uVar4;
  in_RSI[7] = uVar5;
  uVar3 = in_RDI[9];
  uVar4 = in_RDI[10];
  uVar5 = in_RDI[0xb];
  in_RSI[8] = in_RDI[8];
  in_RSI[9] = uVar3;
  in_RSI[10] = uVar4;
  in_RSI[0xb] = uVar5;
  uVar3 = in_RDI[0xd];
  uVar4 = in_RDI[0xe];
  uVar5 = in_RDI[0xf];
  in_RSI[0xc] = in_RDI[0xc];
  in_RSI[0xd] = uVar3;
  in_RSI[0xe] = uVar4;
  in_RSI[0xf] = uVar5;
  auVar1 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0x1c),*in_RDX);
  auVar2 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0x10),*in_RCX);
  auVar1 = vpaddd_avx2(auVar1,auVar2);
  *(undefined1 (*) [32])(in_RSI + 0x10) = auVar1;
  auVar1 = vpaddd_avx2(*(undefined1 (*) [32])(in_RSI + 0x10),(undefined1  [32])*cospi_m24);
  *(undefined1 (*) [32])(in_RSI + 0x10) = auVar1;
  auVar1 = vpsrad_avx2(*(undefined1 (*) [32])(in_RSI + 0x10),ZEXT416((uint)(int)(char)__rounding));
  *(undefined1 (*) [32])(in_RSI + 0x10) = auVar1;
  auVar1 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0x1c),*in_RCX);
  auVar2 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0x10),*in_RDX);
  auVar1 = vpsubd_avx2(auVar1,auVar2);
  *(undefined1 (*) [32])(in_RSI + 0x1c) = auVar1;
  auVar1 = vpaddd_avx2(*(undefined1 (*) [32])(in_RSI + 0x1c),(undefined1  [32])*cospi_m24);
  *(undefined1 (*) [32])(in_RSI + 0x1c) = auVar1;
  auVar1 = vpsrad_avx2(*(undefined1 (*) [32])(in_RSI + 0x1c),ZEXT416((uint)(int)(char)__rounding));
  *(undefined1 (*) [32])(in_RSI + 0x1c) = auVar1;
  auVar1 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0x18),*in_R8);
  auVar2 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0x14),*in_R9);
  auVar1 = vpaddd_avx2(auVar1,auVar2);
  *(undefined1 (*) [32])(in_RSI + 0x14) = auVar1;
  auVar1 = vpaddd_avx2(*(undefined1 (*) [32])(in_RSI + 0x14),(undefined1  [32])*cospi_m24);
  *(undefined1 (*) [32])(in_RSI + 0x14) = auVar1;
  auVar1 = vpsrad_avx2(*(undefined1 (*) [32])(in_RSI + 0x14),ZEXT416((uint)(int)(char)__rounding));
  *(undefined1 (*) [32])(in_RSI + 0x14) = auVar1;
  auVar1 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0x18),*in_R9);
  auVar2 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0x14),*in_R8);
  auVar1 = vpsubd_avx2(auVar1,auVar2);
  *(undefined1 (*) [32])(in_RSI + 0x18) = auVar1;
  auVar1 = vpaddd_avx2(*(undefined1 (*) [32])(in_RSI + 0x18),(undefined1  [32])*cospi_m24);
  *(undefined1 (*) [32])(in_RSI + 0x18) = auVar1;
  auVar1 = vpsrad_avx2(*(undefined1 (*) [32])(in_RSI + 0x18),ZEXT416((uint)(int)(char)__rounding));
  *(undefined1 (*) [32])(in_RSI + 0x18) = auVar1;
  auVar1 = vpaddd_avx2(*(undefined1 (*) [32])(in_RDI + 0x20),*(undefined1 (*) [32])(in_RDI + 0x24));
  *(undefined1 (*) [32])(in_RSI + 0x20) = auVar1;
  auVar1 = vpsubd_avx2(*(undefined1 (*) [32])(in_RDI + 0x20),*(undefined1 (*) [32])(in_RDI + 0x24));
  *(undefined1 (*) [32])(in_RSI + 0x24) = auVar1;
  auVar1 = vpsubd_avx2(*(undefined1 (*) [32])(in_RDI + 0x2c),*(undefined1 (*) [32])(in_RDI + 0x28));
  *(undefined1 (*) [32])(in_RSI + 0x28) = auVar1;
  auVar1 = vpaddd_avx2(*(undefined1 (*) [32])(in_RDI + 0x2c),*(undefined1 (*) [32])(in_RDI + 0x28));
  *(undefined1 (*) [32])(in_RSI + 0x2c) = auVar1;
  auVar1 = vpaddd_avx2(*(undefined1 (*) [32])(in_RDI + 0x30),*(undefined1 (*) [32])(in_RDI + 0x34));
  *(undefined1 (*) [32])(in_RSI + 0x30) = auVar1;
  auVar1 = vpsubd_avx2(*(undefined1 (*) [32])(in_RDI + 0x30),*(undefined1 (*) [32])(in_RDI + 0x34));
  *(undefined1 (*) [32])(in_RSI + 0x34) = auVar1;
  auVar1 = vpsubd_avx2(*(undefined1 (*) [32])(in_RDI + 0x3c),*(undefined1 (*) [32])(in_RDI + 0x38));
  *(undefined1 (*) [32])(in_RSI + 0x38) = auVar1;
  auVar1 = vpaddd_avx2(*(undefined1 (*) [32])(in_RDI + 0x3c),*(undefined1 (*) [32])(in_RDI + 0x38));
  *(undefined1 (*) [32])(in_RSI + 0x3c) = auVar1;
  uVar3 = in_RDI[0x41];
  uVar4 = in_RDI[0x42];
  uVar5 = in_RDI[0x43];
  in_RSI[0x40] = in_RDI[0x40];
  in_RSI[0x41] = uVar3;
  in_RSI[0x42] = uVar4;
  in_RSI[0x43] = uVar5;
  auVar1 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0x44),*in_stack_00000008);
  auVar2 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0x78),*in_RCX);
  auVar1 = vpaddd_avx2(auVar1,auVar2);
  *(undefined1 (*) [32])(in_RSI + 0x44) = auVar1;
  auVar1 = vpaddd_avx2(*(undefined1 (*) [32])(in_RSI + 0x44),(undefined1  [32])*cospi_m24);
  *(undefined1 (*) [32])(in_RSI + 0x44) = auVar1;
  auVar1 = vpsrad_avx2(*(undefined1 (*) [32])(in_RSI + 0x44),ZEXT416((uint)(int)(char)__rounding));
  *(undefined1 (*) [32])(in_RSI + 0x44) = auVar1;
  auVar1 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0x44),*in_RCX);
  auVar2 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0x78),*in_stack_00000008);
  auVar1 = vpsubd_avx2(auVar1,auVar2);
  *(undefined1 (*) [32])(in_RSI + 0x78) = auVar1;
  auVar1 = vpaddd_avx2(*(undefined1 (*) [32])(in_RSI + 0x78),(undefined1  [32])*cospi_m24);
  *(undefined1 (*) [32])(in_RSI + 0x78) = auVar1;
  auVar1 = vpsrad_avx2(*(undefined1 (*) [32])(in_RSI + 0x78),ZEXT416((uint)(int)(char)__rounding));
  *(undefined1 (*) [32])(in_RSI + 0x78) = auVar1;
  auVar1 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0x48),(undefined1  [32])*cospi_m08);
  auVar2 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0x74),*in_stack_00000008);
  auVar1 = vpaddd_avx2(auVar1,auVar2);
  *(undefined1 (*) [32])(in_RSI + 0x48) = auVar1;
  auVar1 = vpaddd_avx2(*(undefined1 (*) [32])(in_RSI + 0x48),(undefined1  [32])*cospi_m24);
  *(undefined1 (*) [32])(in_RSI + 0x48) = auVar1;
  auVar1 = vpsrad_avx2(*(undefined1 (*) [32])(in_RSI + 0x48),ZEXT416((uint)(int)(char)__rounding));
  *(undefined1 (*) [32])(in_RSI + 0x48) = auVar1;
  auVar1 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0x48),*in_stack_00000008);
  auVar2 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0x74),(undefined1  [32])*cospi_m08);
  auVar1 = vpsubd_avx2(auVar1,auVar2);
  *(undefined1 (*) [32])(in_RSI + 0x74) = auVar1;
  auVar1 = vpaddd_avx2(*(undefined1 (*) [32])(in_RSI + 0x74),(undefined1  [32])*cospi_m24);
  *(undefined1 (*) [32])(in_RSI + 0x74) = auVar1;
  auVar1 = vpsrad_avx2(*(undefined1 (*) [32])(in_RSI + 0x74),ZEXT416((uint)(int)(char)__rounding));
  *(undefined1 (*) [32])(in_RSI + 0x74) = auVar1;
  uVar3 = in_RDI[0x4d];
  uVar4 = in_RDI[0x4e];
  uVar5 = in_RDI[0x4f];
  in_RSI[0x4c] = in_RDI[0x4c];
  in_RSI[0x4d] = uVar3;
  in_RSI[0x4e] = uVar4;
  in_RSI[0x4f] = uVar5;
  uVar3 = in_RDI[0x51];
  uVar4 = in_RDI[0x52];
  uVar5 = in_RDI[0x53];
  in_RSI[0x50] = in_RDI[0x50];
  in_RSI[0x51] = uVar3;
  in_RSI[0x52] = uVar4;
  in_RSI[0x53] = uVar5;
  auVar1 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0x54),(undefined1  [32])*cospi_m56);
  auVar2 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0x68),*in_R9);
  auVar1 = vpaddd_avx2(auVar1,auVar2);
  *(undefined1 (*) [32])(in_RSI + 0x54) = auVar1;
  auVar1 = vpaddd_avx2(*(undefined1 (*) [32])(in_RSI + 0x54),(undefined1  [32])*cospi_m24);
  *(undefined1 (*) [32])(in_RSI + 0x54) = auVar1;
  auVar1 = vpsrad_avx2(*(undefined1 (*) [32])(in_RSI + 0x54),ZEXT416((uint)(int)(char)__rounding));
  *(undefined1 (*) [32])(in_RSI + 0x54) = auVar1;
  auVar1 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0x54),*in_R9);
  auVar2 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0x68),(undefined1  [32])*cospi_m56);
  auVar1 = vpsubd_avx2(auVar1,auVar2);
  *(undefined1 (*) [32])(in_RSI + 0x68) = auVar1;
  auVar1 = vpaddd_avx2(*(undefined1 (*) [32])(in_RSI + 0x68),(undefined1  [32])*cospi_m24);
  *(undefined1 (*) [32])(in_RSI + 0x68) = auVar1;
  auVar1 = vpsrad_avx2(*(undefined1 (*) [32])(in_RSI + 0x68),ZEXT416((uint)(int)(char)__rounding));
  *(undefined1 (*) [32])(in_RSI + 0x68) = auVar1;
  auVar1 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0x58),(undefined1  [32])*cospi_m40);
  auVar2 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 100),(undefined1  [32])*cospi_m56);
  auVar1 = vpaddd_avx2(auVar1,auVar2);
  *(undefined1 (*) [32])(in_RSI + 0x58) = auVar1;
  auVar1 = vpaddd_avx2(*(undefined1 (*) [32])(in_RSI + 0x58),(undefined1  [32])*cospi_m24);
  *(undefined1 (*) [32])(in_RSI + 0x58) = auVar1;
  auVar1 = vpsrad_avx2(*(undefined1 (*) [32])(in_RSI + 0x58),ZEXT416((uint)(int)(char)__rounding));
  *(undefined1 (*) [32])(in_RSI + 0x58) = auVar1;
  auVar1 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 0x58),(undefined1  [32])*cospi_m56);
  auVar2 = vpmulld_avx2(*(undefined1 (*) [32])(in_RDI + 100),(undefined1  [32])*cospi_m40);
  auVar1 = vpsubd_avx2(auVar1,auVar2);
  *(undefined1 (*) [32])(in_RSI + 100) = auVar1;
  auVar1 = vpaddd_avx2(*(undefined1 (*) [32])(in_RSI + 100),(undefined1  [32])*cospi_m24);
  *(undefined1 (*) [32])(in_RSI + 100) = auVar1;
  auVar1 = vpsrad_avx2(*(undefined1 (*) [32])(in_RSI + 100),ZEXT416((uint)(int)(char)__rounding));
  *(undefined1 (*) [32])(in_RSI + 100) = auVar1;
  uVar3 = in_RDI[0x5d];
  uVar4 = in_RDI[0x5e];
  uVar5 = in_RDI[0x5f];
  in_RSI[0x5c] = in_RDI[0x5c];
  in_RSI[0x5d] = uVar3;
  in_RSI[0x5e] = uVar4;
  in_RSI[0x5f] = uVar5;
  uVar3 = in_RDI[0x61];
  uVar4 = in_RDI[0x62];
  uVar5 = in_RDI[99];
  in_RSI[0x60] = in_RDI[0x60];
  in_RSI[0x61] = uVar3;
  in_RSI[0x62] = uVar4;
  in_RSI[99] = uVar5;
  uVar3 = in_RDI[0x6d];
  uVar4 = in_RDI[0x6e];
  uVar5 = in_RDI[0x6f];
  in_RSI[0x6c] = in_RDI[0x6c];
  in_RSI[0x6d] = uVar3;
  in_RSI[0x6e] = uVar4;
  in_RSI[0x6f] = uVar5;
  uVar3 = in_RDI[0x71];
  uVar4 = in_RDI[0x72];
  uVar5 = in_RDI[0x73];
  in_RSI[0x70] = in_RDI[0x70];
  in_RSI[0x71] = uVar3;
  in_RSI[0x72] = uVar4;
  in_RSI[0x73] = uVar5;
  uVar3 = in_RDI[0x7d];
  uVar4 = in_RDI[0x7e];
  uVar5 = in_RDI[0x7f];
  in_RSI[0x7c] = in_RDI[0x7c];
  in_RSI[0x7d] = uVar3;
  in_RSI[0x7e] = uVar4;
  in_RSI[0x7f] = uVar5;
  auVar1 = vpaddd_avx2(*(undefined1 (*) [32])(in_RDI + 0x80),*(undefined1 (*) [32])(in_RDI + 0x8c));
  *(undefined1 (*) [32])(in_RSI + 0x80) = auVar1;
  auVar1 = vpsubd_avx2(*(undefined1 (*) [32])(in_RDI + 0x80),*(undefined1 (*) [32])(in_RDI + 0x8c));
  *(undefined1 (*) [32])(in_RSI + 0x8c) = auVar1;
  auVar1 = vpaddd_avx2(*(undefined1 (*) [32])(in_RDI + 0x84),*(undefined1 (*) [32])(in_RDI + 0x88));
  *(undefined1 (*) [32])(in_RSI + 0x84) = auVar1;
  auVar1 = vpsubd_avx2(*(undefined1 (*) [32])(in_RDI + 0x84),*(undefined1 (*) [32])(in_RDI + 0x88));
  *(undefined1 (*) [32])(in_RSI + 0x88) = auVar1;
  auVar1 = vpsubd_avx2(*(undefined1 (*) [32])(in_RDI + 0x9c),*(undefined1 (*) [32])(in_RDI + 0x90));
  *(undefined1 (*) [32])(in_RSI + 0x90) = auVar1;
  auVar1 = vpaddd_avx2(*(undefined1 (*) [32])(in_RDI + 0x9c),*(undefined1 (*) [32])(in_RDI + 0x90));
  *(undefined1 (*) [32])(in_RSI + 0x9c) = auVar1;
  auVar1 = vpsubd_avx2(*(undefined1 (*) [32])(in_RDI + 0x98),*(undefined1 (*) [32])(in_RDI + 0x94));
  *(undefined1 (*) [32])(in_RSI + 0x94) = auVar1;
  auVar1 = vpaddd_avx2(*(undefined1 (*) [32])(in_RDI + 0x98),*(undefined1 (*) [32])(in_RDI + 0x94));
  *(undefined1 (*) [32])(in_RSI + 0x98) = auVar1;
  auVar1 = vpaddd_avx2(*(undefined1 (*) [32])(in_RDI + 0xa0),*(undefined1 (*) [32])(in_RDI + 0xac));
  *(undefined1 (*) [32])(in_RSI + 0xa0) = auVar1;
  auVar1 = vpsubd_avx2(*(undefined1 (*) [32])(in_RDI + 0xa0),*(undefined1 (*) [32])(in_RDI + 0xac));
  *(undefined1 (*) [32])(in_RSI + 0xac) = auVar1;
  auVar1 = vpaddd_avx2(*(undefined1 (*) [32])(in_RDI + 0xa4),*(undefined1 (*) [32])(in_RDI + 0xa8));
  *(undefined1 (*) [32])(in_RSI + 0xa4) = auVar1;
  auVar1 = vpsubd_avx2(*(undefined1 (*) [32])(in_RDI + 0xa4),*(undefined1 (*) [32])(in_RDI + 0xa8));
  *(undefined1 (*) [32])(in_RSI + 0xa8) = auVar1;
  auVar1 = vpsubd_avx2(*(undefined1 (*) [32])(in_RDI + 0xbc),*(undefined1 (*) [32])(in_RDI + 0xb0));
  *(undefined1 (*) [32])(in_RSI + 0xb0) = auVar1;
  auVar1 = vpaddd_avx2(*(undefined1 (*) [32])(in_RDI + 0xbc),*(undefined1 (*) [32])(in_RDI + 0xb0));
  *(undefined1 (*) [32])(in_RSI + 0xbc) = auVar1;
  auVar1 = vpsubd_avx2(*(undefined1 (*) [32])(in_RDI + 0xb8),*(undefined1 (*) [32])(in_RDI + 0xb4));
  *(undefined1 (*) [32])(in_RSI + 0xb4) = auVar1;
  auVar1 = vpaddd_avx2(*(undefined1 (*) [32])(in_RDI + 0xb8),*(undefined1 (*) [32])(in_RDI + 0xb4));
  *(undefined1 (*) [32])(in_RSI + 0xb8) = auVar1;
  auVar1 = vpaddd_avx2(*(undefined1 (*) [32])(in_RDI + 0xc0),*(undefined1 (*) [32])(in_RDI + 0xcc));
  *(undefined1 (*) [32])(in_RSI + 0xc0) = auVar1;
  auVar1 = vpsubd_avx2(*(undefined1 (*) [32])(in_RDI + 0xc0),*(undefined1 (*) [32])(in_RDI + 0xcc));
  *(undefined1 (*) [32])(in_RSI + 0xcc) = auVar1;
  auVar1 = vpaddd_avx2(*(undefined1 (*) [32])(in_RDI + 0xc4),*(undefined1 (*) [32])(in_RDI + 200));
  *(undefined1 (*) [32])(in_RSI + 0xc4) = auVar1;
  auVar1 = vpsubd_avx2(*(undefined1 (*) [32])(in_RDI + 0xc4),*(undefined1 (*) [32])(in_RDI + 200));
  *(undefined1 (*) [32])(in_RSI + 200) = auVar1;
  auVar1 = vpsubd_avx2(*(undefined1 (*) [32])(in_RDI + 0xdc),*(undefined1 (*) [32])(in_RDI + 0xd0));
  *(undefined1 (*) [32])(in_RSI + 0xd0) = auVar1;
  auVar1 = vpaddd_avx2(*(undefined1 (*) [32])(in_RDI + 0xdc),*(undefined1 (*) [32])(in_RDI + 0xd0));
  *(undefined1 (*) [32])(in_RSI + 0xdc) = auVar1;
  auVar1 = vpsubd_avx2(*(undefined1 (*) [32])(in_RDI + 0xd8),*(undefined1 (*) [32])(in_RDI + 0xd4));
  *(undefined1 (*) [32])(in_RSI + 0xd4) = auVar1;
  auVar1 = vpaddd_avx2(*(undefined1 (*) [32])(in_RDI + 0xd8),*(undefined1 (*) [32])(in_RDI + 0xd4));
  *(undefined1 (*) [32])(in_RSI + 0xd8) = auVar1;
  auVar1 = vpaddd_avx2(*(undefined1 (*) [32])(in_RDI + 0xe0),*(undefined1 (*) [32])(in_RDI + 0xec));
  *(undefined1 (*) [32])(in_RSI + 0xe0) = auVar1;
  auVar1 = vpsubd_avx2(*(undefined1 (*) [32])(in_RDI + 0xe0),*(undefined1 (*) [32])(in_RDI + 0xec));
  *(undefined1 (*) [32])(in_RSI + 0xec) = auVar1;
  auVar1 = vpaddd_avx2(*(undefined1 (*) [32])(in_RDI + 0xe4),*(undefined1 (*) [32])(in_RDI + 0xe8));
  *(undefined1 (*) [32])(in_RSI + 0xe4) = auVar1;
  auVar1 = vpsubd_avx2(*(undefined1 (*) [32])(in_RDI + 0xe4),*(undefined1 (*) [32])(in_RDI + 0xe8));
  *(undefined1 (*) [32])(in_RSI + 0xe8) = auVar1;
  auVar1 = vpsubd_avx2(*(undefined1 (*) [32])(in_RDI + 0xfc),*(undefined1 (*) [32])(in_RDI + 0xf0));
  *(undefined1 (*) [32])(in_RSI + 0xf0) = auVar1;
  auVar1 = vpaddd_avx2(*(undefined1 (*) [32])(in_RDI + 0xfc),*(undefined1 (*) [32])(in_RDI + 0xf0));
  *(undefined1 (*) [32])(in_RSI + 0xfc) = auVar1;
  auVar1 = vpsubd_avx2(*(undefined1 (*) [32])(in_RDI + 0xf8),*(undefined1 (*) [32])(in_RDI + 0xf4));
  *(undefined1 (*) [32])(in_RSI + 0xf4) = auVar1;
  auVar1 = vpaddd_avx2(*(undefined1 (*) [32])(in_RDI + 0xf8),*(undefined1 (*) [32])(in_RDI + 0xf4));
  *(undefined1 (*) [32])(in_RSI + 0xf8) = auVar1;
  return;
}

Assistant:

static inline void fdct64_stage7_avx2(__m256i *x6, __m256i *x7,
                                      __m256i *cospi_p08, __m256i *cospi_p56,
                                      __m256i *cospi_p40, __m256i *cospi_p24,
                                      __m256i *cospi_m08, __m256i *cospi_m56,
                                      __m256i *cospi_m40, __m256i *cospi_m24,
                                      const __m256i *__rounding,
                                      int8_t cos_bit) {
  x7[0] = x6[0];
  x7[1] = x6[1];
  x7[2] = x6[2];
  x7[3] = x6[3];
  btf_32_type0_avx2_new(*cospi_p08, *cospi_p56, x6[7], x6[4], x7[4], x7[7],
                        *__rounding, cos_bit);
  btf_32_type0_avx2_new(*cospi_p40, *cospi_p24, x6[6], x6[5], x7[5], x7[6],
                        *__rounding, cos_bit);
  x7[8] = _mm256_add_epi32(x6[8], x6[9]);
  x7[9] = _mm256_sub_epi32(x6[8], x6[9]);
  x7[10] = _mm256_sub_epi32(x6[11], x6[10]);
  x7[11] = _mm256_add_epi32(x6[11], x6[10]);
  x7[12] = _mm256_add_epi32(x6[12], x6[13]);
  x7[13] = _mm256_sub_epi32(x6[12], x6[13]);
  x7[14] = _mm256_sub_epi32(x6[15], x6[14]);
  x7[15] = _mm256_add_epi32(x6[15], x6[14]);
  x7[16] = x6[16];
  btf_32_type0_avx2_new(*cospi_m08, *cospi_p56, x6[17], x6[30], x7[17], x7[30],
                        *__rounding, cos_bit);
  btf_32_type0_avx2_new(*cospi_m56, *cospi_m08, x6[18], x6[29], x7[18], x7[29],
                        *__rounding, cos_bit);
  x7[19] = x6[19];
  x7[20] = x6[20];
  btf_32_type0_avx2_new(*cospi_m40, *cospi_p24, x6[21], x6[26], x7[21], x7[26],
                        *__rounding, cos_bit);
  btf_32_type0_avx2_new(*cospi_m24, *cospi_m40, x6[22], x6[25], x7[22], x7[25],
                        *__rounding, cos_bit);
  x7[23] = x6[23];
  x7[24] = x6[24];
  x7[27] = x6[27];
  x7[28] = x6[28];
  x7[31] = x6[31];
  x7[32] = _mm256_add_epi32(x6[32], x6[35]);
  x7[35] = _mm256_sub_epi32(x6[32], x6[35]);
  x7[33] = _mm256_add_epi32(x6[33], x6[34]);
  x7[34] = _mm256_sub_epi32(x6[33], x6[34]);
  x7[36] = _mm256_sub_epi32(x6[39], x6[36]);
  x7[39] = _mm256_add_epi32(x6[39], x6[36]);
  x7[37] = _mm256_sub_epi32(x6[38], x6[37]);
  x7[38] = _mm256_add_epi32(x6[38], x6[37]);
  x7[40] = _mm256_add_epi32(x6[40], x6[43]);
  x7[43] = _mm256_sub_epi32(x6[40], x6[43]);
  x7[41] = _mm256_add_epi32(x6[41], x6[42]);
  x7[42] = _mm256_sub_epi32(x6[41], x6[42]);
  x7[44] = _mm256_sub_epi32(x6[47], x6[44]);
  x7[47] = _mm256_add_epi32(x6[47], x6[44]);
  x7[45] = _mm256_sub_epi32(x6[46], x6[45]);
  x7[46] = _mm256_add_epi32(x6[46], x6[45]);
  x7[48] = _mm256_add_epi32(x6[48], x6[51]);
  x7[51] = _mm256_sub_epi32(x6[48], x6[51]);
  x7[49] = _mm256_add_epi32(x6[49], x6[50]);
  x7[50] = _mm256_sub_epi32(x6[49], x6[50]);
  x7[52] = _mm256_sub_epi32(x6[55], x6[52]);
  x7[55] = _mm256_add_epi32(x6[55], x6[52]);
  x7[53] = _mm256_sub_epi32(x6[54], x6[53]);
  x7[54] = _mm256_add_epi32(x6[54], x6[53]);
  x7[56] = _mm256_add_epi32(x6[56], x6[59]);
  x7[59] = _mm256_sub_epi32(x6[56], x6[59]);
  x7[57] = _mm256_add_epi32(x6[57], x6[58]);
  x7[58] = _mm256_sub_epi32(x6[57], x6[58]);
  x7[60] = _mm256_sub_epi32(x6[63], x6[60]);
  x7[63] = _mm256_add_epi32(x6[63], x6[60]);
  x7[61] = _mm256_sub_epi32(x6[62], x6[61]);
  x7[62] = _mm256_add_epi32(x6[62], x6[61]);
}